

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::Matrix::gaussianEliminate(Matrix *this)

{
  uint uVar1;
  int iVar2;
  double **ppdVar3;
  double *pdVar4;
  bool bVar5;
  ulong uVar6;
  double **extraout_RDX;
  double **ppdVar7;
  ulong uVar8;
  Matrix *in_RSI;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  Matrix MVar18;
  
  Matrix(this,in_RSI);
  uVar6 = (ulong)this->rows_;
  ppdVar7 = extraout_RDX;
  if (0 < (long)uVar6) {
    iVar2 = this->cols_;
    uVar1 = iVar2 - 1;
    ppdVar7 = (double **)(ulong)uVar1;
    ppdVar3 = this->p;
    uVar9 = 1;
    iVar11 = 0;
    uVar10 = 0;
    do {
      if (iVar11 < (int)uVar1) {
        bVar5 = false;
        do {
          dVar16 = ppdVar3[uVar10][iVar11];
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
LAB_0011cb78:
            bVar5 = true;
          }
          else {
            uVar8 = uVar10 & 0xffffffff;
            if (uVar10 + 1 < uVar6) {
              dVar16 = 0.0;
              uVar8 = uVar10 & 0xffffffff;
              uVar12 = uVar9;
              do {
                dVar17 = ppdVar3[uVar12][iVar11];
                uVar15 = -(ulong)(dVar17 < -dVar17);
                dVar17 = (double)(~uVar15 & (ulong)dVar17 | (ulong)-dVar17 & uVar15);
                if (dVar16 < dVar17) {
                  uVar8 = uVar12 & 0xffffffff;
                  dVar16 = dVar17;
                }
                uVar12 = uVar12 + 1;
              } while (uVar6 != uVar12);
            }
            if (uVar10 != uVar8) {
              pdVar4 = ppdVar3[(int)uVar8];
              ppdVar3[(int)uVar8] = ppdVar3[uVar10];
              ppdVar3[uVar10] = pdVar4;
              goto LAB_0011cb78;
            }
            iVar11 = iVar11 + 1;
          }
        } while ((iVar11 < (int)uVar1) && (!bVar5));
      }
      else {
        bVar5 = false;
      }
      uVar8 = uVar10 + 1;
      if ((bool)(uVar8 < uVar6 & bVar5)) {
        uVar12 = uVar9;
        do {
          lVar14 = (long)(iVar11 + 1);
          iVar13 = uVar1 - iVar11;
          if (iVar11 + 1 < iVar2) {
            do {
              pdVar4 = ppdVar3[uVar12];
              dVar16 = pdVar4[lVar14] -
                       (pdVar4[iVar11] / ppdVar3[uVar10][iVar11]) * ppdVar3[uVar10][lVar14];
              pdVar4[lVar14] = (double)(~-(ulong)(ABS(dVar16) < 1e-10) & (ulong)dVar16);
              lVar14 = lVar14 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          ppdVar3[uVar12][iVar11] = 0.0;
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar6);
      }
      iVar11 = iVar11 + 1;
      uVar9 = uVar9 + 1;
      uVar10 = uVar8;
    } while (uVar8 != uVar6);
  }
  MVar18.p = ppdVar7;
  MVar18._0_8_ = this;
  return MVar18;
}

Assistant:

Matrix Matrix::gaussianEliminate()
{
    Matrix Ab(*this);
    int rows = Ab.rows_;
    int cols = Ab.cols_;
    int Acols = cols - 1;

    int i = 0; // row tracker
    int j = 0; // column tracker

    // iterate through the rows
    while (i < rows)
    {
        // find a pivot for the row
        bool pivot_found = false;
        while (j < Acols && !pivot_found)
        {
            if (Ab(i, j) != 0) { // pivot not equal to 0
                pivot_found = true;
            } else { // check for a possible swap
                int max_row = i;
                double max_val = 0;
                for (int k = i + 1; k < rows; ++k)
                {
                    double cur_abs = Ab(k, j) >= 0 ? Ab(k, j) : -1 * Ab(k, j);
                    if (cur_abs > max_val)
                    {
                        max_row = k;
                        max_val = cur_abs;
                    }
                }
                if (max_row != i) {
                    Ab.swapRows(max_row, i);
                    pivot_found = true;
                } else {
                    j++;
                }
            }
        }

        // perform elimination as normal if pivot was found
        if (pivot_found)
        {
            for (int t = i + 1; t < rows; ++t) {
                for (int s = j + 1; s < cols; ++s) {
                    Ab(t, s) = Ab(t, s) - Ab(i, s) * (Ab(t, j) / Ab(i, j));
                    if (Ab(t, s) < EPS && Ab(t, s) > -1*EPS)
                        Ab(t, s) = 0;
                }
                Ab(t, j) = 0;
            }
        }

        i++;
        j++;
    }

    return Ab;
}